

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

size_t mbedtls_mpi_bitlen(mbedtls_mpi *X)

{
  long local_28;
  size_t j;
  size_t i;
  mbedtls_mpi *X_local;
  
  if (X->n == 0) {
    X_local = (mbedtls_mpi *)0x0;
  }
  else {
    j = X->n;
    do {
      j = j - 1;
      if (j == 0) break;
    } while (X->p[j] == 0);
    local_28 = 0x40;
    while ((local_28 != 0 && ((X->p[j] >> ((char)local_28 - 1U & 0x3f) & 1) == 0))) {
      local_28 = local_28 + -1;
    }
    X_local = (mbedtls_mpi *)(j * 0x40 + local_28);
  }
  return (size_t)X_local;
}

Assistant:

size_t mbedtls_mpi_bitlen( const mbedtls_mpi *X )
{
    size_t i, j;

    if( X->n == 0 )
        return( 0 );

    for( i = X->n - 1; i > 0; i-- )
        if( X->p[i] != 0 )
            break;

    for( j = biL; j > 0; j-- )
        if( ( ( X->p[i] >> ( j - 1 ) ) & 1 ) != 0 )
            break;

    return( ( i * biL ) + j );
}